

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghsymbol.cc
# Opt level: O1

void __thiscall EndSymbol::restoreXml(EndSymbol *this,Element *el,SleighBase *trans)

{
  PatternExpression *pPVar1;
  
  this->const_space = (trans->super_Translate).super_AddrSpaceManager.constantspace;
  pPVar1 = (PatternExpression *)operator_new(0x10);
  pPVar1->refcount = 0;
  pPVar1->_vptr_PatternExpression = (_func_int **)&PTR__PatternExpression_003cd400;
  this->patexp = pPVar1;
  pPVar1->refcount = 1;
  return;
}

Assistant:

void EndSymbol::restoreXml(const Element *el,SleighBase *trans)

{
  const_space = trans->getConstantSpace();
  patexp = new EndInstructionValue();
  patexp->layClaim();
}